

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pushdown_inner_join.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::FilterPushdown::PushdownInnerJoin
          (FilterPushdown *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op,unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *left_bindings,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *right_bindings)

{
  pointer pLVar1;
  FilterResult FVar2;
  pointer pLVar3;
  pointer pLVar4;
  LogicalAnyJoin *pLVar5;
  reference args;
  reference args_1;
  LogicalOperator *this_00;
  pointer pLVar6;
  _Head_base<0UL,_duckdb::LogicalCrossProduct_*,_false> _Var7;
  undefined1 local_80 [16];
  undefined8 local_70;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_68;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_60;
  _Head_base<0UL,_duckdb::LogicalCrossProduct_*,_false> local_58;
  undefined8 local_50;
  JoinCondition local_48;
  
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)left_bindings);
  pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)left_bindings);
  if (pLVar4->type == LOGICAL_DELIM_JOIN) {
    local_58._M_head_impl = (LogicalCrossProduct *)(left_bindings->_M_h)._M_buckets;
    (left_bindings->_M_h)._M_buckets = (__buckets_ptr)0x0;
    FinishPushdown(this,op);
    _Var7._M_head_impl = local_58._M_head_impl;
  }
  else {
    pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)left_bindings);
    local_68._M_head_impl = (LogicalOperator *)this;
    if (pLVar4->type == LOGICAL_ANY_JOIN) {
      pLVar5 = LogicalOperator::Cast<duckdb::LogicalAnyJoin>(pLVar3);
      local_60._M_head_impl =
           (pLVar5->condition).
           super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pLVar5->condition).
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      FVar2 = AddFilter((FilterPushdown *)op,
                        (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)&local_60);
      if (local_60._M_head_impl != (Expression *)0x0) {
        (*((local_60._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_60._M_head_impl = (Expression *)0x0;
      if (FVar2 == UNSATISFIABLE) {
        make_uniq<duckdb::LogicalEmptyResult,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                  ((duckdb *)local_80,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)left_bindings);
        (local_68._M_head_impl)->_vptr_LogicalOperator = (_func_int **)local_80._0_8_;
        return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                )local_68._M_head_impl;
      }
    }
    else {
      pLVar1 = (pointer)pLVar3[1].estimated_cardinality;
      for (pLVar6 = pLVar3[1].types.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage; pLVar6 != pLVar1;
          pLVar6 = pLVar6 + 1) {
        local_48.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
        ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             *(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)pLVar6;
        pLVar6->id_ = INVALID;
        pLVar6->physical_type_ = ~INVALID;
        *(undefined6 *)&pLVar6->field_0x2 = 0;
        local_48.right.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (pLVar6->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (pLVar6->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_48.comparison =
             *(ExpressionType *)
              &(pLVar6->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
        JoinCondition::CreateExpression((JoinCondition *)local_80,&local_48);
        JoinCondition::~JoinCondition(&local_48);
        local_80._8_8_ = local_80._0_8_;
        local_80._0_8_ =
             (__uniq_ptr_data<duckdb::LogicalCrossProduct,_std::default_delete<duckdb::LogicalCrossProduct>,_true,_true>
              )0x0;
        FVar2 = AddFilter((FilterPushdown *)op,
                          (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)(local_80 + 8));
        if ((_Tuple_impl<0UL,_duckdb::LogicalCrossProduct_*,_std::default_delete<duckdb::LogicalCrossProduct>_>
             )local_80._8_8_ != (LogicalCrossProduct *)0x0) {
          (*(code *)(*(__node_base_ptr *)local_80._8_8_)[1]._M_nxt)();
        }
        local_80._8_8_ = (Expression *)0x0;
        if (FVar2 == UNSATISFIABLE) {
          make_uniq<duckdb::LogicalEmptyResult,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                    ((duckdb *)&local_50,
                     (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      *)left_bindings);
          (local_68._M_head_impl)->_vptr_LogicalOperator = local_50;
          this = (FilterPushdown *)local_68;
          _Var7._M_head_impl = (LogicalCrossProduct *)local_80._0_8_;
          goto LAB_01a7436a;
        }
        if ((LogicalCrossProduct *)local_80._0_8_ != (LogicalCrossProduct *)0x0) {
          (*(code *)(*(__node_base_ptr *)local_80._0_8_)[1]._M_nxt)();
        }
      }
    }
    GenerateFilters((FilterPushdown *)op);
    pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)left_bindings);
    args = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(&pLVar3->children,0);
    pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)left_bindings);
    args_1 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::get<true>(&pLVar3->children,1);
    make_uniq<duckdb::LogicalCrossProduct,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
              ((duckdb *)local_80,args,args_1);
    pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)left_bindings);
    if (pLVar3->has_estimated_cardinality == true) {
      this_00 = (LogicalOperator *)
                unique_ptr<duckdb::LogicalCrossProduct,_std::default_delete<duckdb::LogicalCrossProduct>,_true>
                ::operator->((unique_ptr<duckdb::LogicalCrossProduct,_std::default_delete<duckdb::LogicalCrossProduct>,_true>
                              *)local_80);
      pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)left_bindings);
      LogicalOperator::SetEstimatedCardinality(this_00,pLVar3->estimated_cardinality);
    }
    this = (FilterPushdown *)local_68;
    local_70 = (LogicalCrossProduct *)local_80._0_8_;
    local_80._0_8_ =
         (__uniq_ptr_data<duckdb::LogicalCrossProduct,_std::default_delete<duckdb::LogicalCrossProduct>,_true,_true>
          )0x0;
    PushdownCrossProduct((FilterPushdown *)local_68._M_head_impl,op);
    if (local_70 != (LogicalCrossProduct *)0x0) {
      (*(code *)((__node_base_ptr)
                (local_70->super_LogicalUnconditionalJoin).super_LogicalOperator.
                _vptr_LogicalOperator)[1]._M_nxt)();
    }
    local_70._0_1_ = INVALID;
    local_70._1_7_ = 0;
    _Var7._M_head_impl = (LogicalCrossProduct *)local_80._0_8_;
  }
LAB_01a7436a:
  if ((_Tuple_impl<0UL,_duckdb::LogicalCrossProduct_*,_std::default_delete<duckdb::LogicalCrossProduct>_>
       )_Var7._M_head_impl != (LogicalCrossProduct *)0x0) {
    (*(code *)(*(__node_base_ptr *)_Var7._M_head_impl)[1]._M_nxt)();
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         )this;
}

Assistant:

unique_ptr<LogicalOperator> FilterPushdown::PushdownInnerJoin(unique_ptr<LogicalOperator> op,
                                                              unordered_set<idx_t> &left_bindings,
                                                              unordered_set<idx_t> &right_bindings) {
	auto &join = op->Cast<LogicalJoin>();
	D_ASSERT(join.join_type == JoinType::INNER);
	if (op->type == LogicalOperatorType::LOGICAL_DELIM_JOIN) {
		return FinishPushdown(std::move(op));
	}
	// inner join: gather all the conditions of the inner join and add to the filter list
	if (op->type == LogicalOperatorType::LOGICAL_ANY_JOIN) {
		auto &any_join = join.Cast<LogicalAnyJoin>();
		// any join: only one filter to add
		if (AddFilter(std::move(any_join.condition)) == FilterResult::UNSATISFIABLE) {
			// filter statically evaluates to false, strip tree
			return make_uniq<LogicalEmptyResult>(std::move(op));
		}
	} else {
		// comparison join
		D_ASSERT(op->type == LogicalOperatorType::LOGICAL_COMPARISON_JOIN);
		auto &comp_join = join.Cast<LogicalComparisonJoin>();
		// turn the conditions into filters
		for (auto &i : comp_join.conditions) {
			auto condition = JoinCondition::CreateExpression(std::move(i));
			if (AddFilter(std::move(condition)) == FilterResult::UNSATISFIABLE) {
				// filter statically evaluates to false, strip tree
				return make_uniq<LogicalEmptyResult>(std::move(op));
			}
		}
	}
	GenerateFilters();

	// turn the inner join into a cross product
	auto cross_product = make_uniq<LogicalCrossProduct>(std::move(op->children[0]), std::move(op->children[1]));

	// preserve the estimated cardinality of the operator
	if (op->has_estimated_cardinality) {
		cross_product->SetEstimatedCardinality(op->estimated_cardinality);
	}

	// then push down cross product
	return PushdownCrossProduct(std::move(cross_product));
}